

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointLightCluster.cpp
# Opt level: O0

int __thiscall arealights::PointLightCluster::init(PointLightCluster *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  string *psVar2;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [16];
  string local_70 [55];
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [16];
  PointLightCluster *this_local;
  
  local_18._8_8_ = this;
  psVar2 = (string *)
           std::
           __shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"../assets/PointLightCluster.vs.glsl",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"../assets/PointLightCluster.fs.glsl",(allocator<char> *)(local_80 + 0xf));
  RenderHelper::makeSimpleShader((RenderHelper *)local_18,psVar2,&local_38);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::operator=
            (&this->_shader,
             (unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_18);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_18);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)(local_80 + 0xf));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  psVar2 = (string *)
           std::
           __shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"../assets/SphereLightVolume.vs.glsl",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"../assets/SphereLightVolume.fs.glsl",&local_c9);
  RenderHelper::makeSimpleShader((RenderHelper *)local_80,psVar2,&local_a0);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::operator=
            (&this->_sphereLightVolumeShader,
             (unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_80);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_80);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  iVar1 = std::allocator<char>::~allocator(&local_a1);
  return iVar1;
}

Assistant:

void PointLightCluster::init()
{
    _shader = _renderHelper->makeSimpleShader(
        "../assets/PointLightCluster.vs.glsl",
        "../assets/PointLightCluster.fs.glsl"
    );

    _sphereLightVolumeShader = _renderHelper->makeSimpleShader(
        "../assets/SphereLightVolume.vs.glsl",
        "../assets/SphereLightVolume.fs.glsl"
    );
}